

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall
QL_Manager::Delete(QL_Manager *this,char *relName,int nConditions,Condition *conditions)

{
  char *pcVar1;
  Condition *conditions_00;
  QL_Manager *this_00;
  RC RVar2;
  ostream *poVar3;
  RelCatEntry *pRVar4;
  AttrCatEntry *pAVar5;
  long lVar6;
  long lVar7;
  AttrCatEntry *pAVar8;
  QL_Manager *this_01;
  ulong uVar9;
  ulong uVar10;
  QL_Node *topNode;
  char *local_48;
  Condition *local_40;
  QL_Manager *local_38;
  
  local_38 = this;
  std::operator<<((ostream *)&std::cout,"Delete\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   relName = ");
  local_48 = relName;
  poVar3 = std::operator<<(poVar3,relName);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   nCondtions = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nConditions);
  std::operator<<(poVar3,"\n");
  uVar10 = 0;
  uVar9 = 0;
  local_40 = conditions;
  if (0 < nConditions) {
    uVar9 = (ulong)(uint)nConditions;
  }
  for (; this_00 = local_38, uVar9 != uVar10; uVar10 = uVar10 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"   conditions[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar10);
    poVar3 = std::operator<<(poVar3,"]:");
    poVar3 = operator<<(poVar3,conditions);
    std::operator<<(poVar3,"\n");
    conditions = conditions + 1;
  }
  Reset(local_38);
  conditions_00 = local_40;
  this_00->condptr = local_40;
  this_00->nConds = nConditions;
  pRVar4 = (RelCatEntry *)malloc(0x34);
  this_00->relEntries = pRVar4;
  pRVar4->relName[0] = '\0';
  pRVar4->relName[1] = '\0';
  pRVar4->relName[2] = '\0';
  pRVar4->relName[3] = '\0';
  pRVar4->relName[4] = '\0';
  pRVar4->relName[5] = '\0';
  pRVar4->relName[6] = '\0';
  pRVar4->relName[7] = '\0';
  pRVar4->relName[8] = '\0';
  pRVar4->relName[9] = '\0';
  pRVar4->relName[10] = '\0';
  pRVar4->relName[0xb] = '\0';
  pRVar4->relName[0xc] = '\0';
  pRVar4->relName[0xd] = '\0';
  pRVar4->relName[0xe] = '\0';
  pRVar4->relName[0xf] = '\0';
  pRVar4->relName[9] = '\0';
  pRVar4->relName[10] = '\0';
  pRVar4->relName[0xb] = '\0';
  pRVar4->relName[0xc] = '\0';
  pRVar4->relName[0xd] = '\0';
  pRVar4->relName[0xe] = '\0';
  pRVar4->relName[0xf] = '\0';
  pRVar4->relName[0x10] = '\0';
  pRVar4->relName[0x11] = '\0';
  pRVar4->relName[0x12] = '\0';
  pRVar4->relName[0x13] = '\0';
  pRVar4->relName[0x14] = '\0';
  pRVar4->relName[0x15] = '\0';
  pRVar4->relName[0x16] = '\0';
  pRVar4->relName[0x17] = '\0';
  pRVar4->relName[0x18] = '\0';
  pRVar4->tupleLength = 0;
  pRVar4->attrCount = 0;
  pRVar4->indexCount = 0;
  pRVar4->indexCurrNum = 0;
  pRVar4->numTuples = 0;
  pRVar4->statsInitialized = false;
  *(undefined3 *)&pRVar4->field_0x31 = 0;
  pRVar4->statsInitialized = true;
  RVar2 = SetUpOneRelation(this_00,local_48);
  pAVar8 = (AttrCatEntry *)this_00->relEntries;
  if (RVar2 == 0) {
    uVar9 = (ulong)*(int *)(pAVar8->attrName + 7);
    pAVar5 = (AttrCatEntry *)malloc(uVar9 * 0x54);
    this_00->attrEntries = pAVar5;
    pAVar5->relName[0] = '\0';
    pAVar5->relName[1] = '\0';
    pAVar5->relName[2] = '\0';
    pAVar5->relName[3] = '\0';
    pAVar5->relName[4] = '\0';
    pAVar5->relName[5] = '\0';
    pAVar5->relName[6] = '\0';
    pAVar5->relName[7] = '\0';
    pAVar5->relName[8] = '\0';
    pAVar5->relName[9] = '\0';
    pAVar5->relName[10] = '\0';
    pAVar5->relName[0xb] = '\0';
    pAVar5->relName[0xc] = '\0';
    pAVar5->relName[0xd] = '\0';
    pAVar5->relName[0xe] = '\0';
    pAVar5->relName[0xf] = '\0';
    pAVar5->relName[0x10] = '\0';
    pAVar5->relName[0x11] = '\0';
    pAVar5->relName[0x12] = '\0';
    pAVar5->relName[0x13] = '\0';
    pAVar5->relName[0x14] = '\0';
    pAVar5->relName[0x15] = '\0';
    pAVar5->relName[0x16] = '\0';
    pAVar5->relName[0x17] = '\0';
    *(undefined8 *)(pAVar5->relName + 0x18) = 0;
    pAVar5->attrName[7] = '\0';
    pAVar5->attrName[8] = '\0';
    pAVar5->attrName[9] = '\0';
    pAVar5->attrName[10] = '\0';
    pAVar5->attrName[0xb] = '\0';
    pAVar5->attrName[0xc] = '\0';
    pAVar5->attrName[0xd] = '\0';
    pAVar5->attrName[0xe] = '\0';
    pAVar5->attrName[0xf] = '\0';
    pAVar5->attrName[0x10] = '\0';
    pAVar5->attrName[0x11] = '\0';
    pAVar5->attrName[0x12] = '\0';
    pAVar5->attrName[0x13] = '\0';
    pAVar5->attrName[0x14] = '\0';
    pAVar5->attrName[0x15] = '\0';
    pAVar5->attrName[0x16] = '\0';
    *(undefined8 *)(pAVar5->attrName + 0x17) = 0;
    pAVar5->attrType = INT;
    pAVar5->attrLength = 0;
    pAVar5->minValue = 0.0;
    pAVar5->indexNo = 0;
    pAVar5->attrNum = 0;
    pAVar5->numDistinct = 0;
    pAVar5->maxValue = 0.0;
    lVar6 = 0x4c;
    for (lVar7 = 0; lVar7 < (int)uVar9; lVar7 = lVar7 + 1) {
      pAVar8 = this_00->attrEntries;
      pcVar1 = pAVar8->relName + lVar6 + -0x2c;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1 = pAVar8->relName + lVar6 + -0x3c;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1 = pAVar8->relName + lVar6 + -0x4c;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      (pAVar8->relName + lVar6 + -0x1c)[0] = '\0';
      (pAVar8->relName + lVar6 + -0x1c)[1] = '\0';
      pcVar1 = pAVar8->relName + lVar6 + -0x18;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1 = pAVar8->relName + lVar6 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1 = pAVar8->relName + lVar6;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = '\0';
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = '\x7f';
      pcVar1[7] = '\x7f';
      pAVar8 = (AttrCatEntry *)this_00->relEntries;
      uVar9 = (ulong)*(uint *)(pAVar8->attrName + 7);
      lVar6 = lVar6 + 0x54;
    }
    RVar2 = SM_Manager::GetAttrForRel
                      (this_00->smm,(RelCatEntry *)pAVar8,this_00->attrEntries,&this_00->attrToRel);
    if ((RVar2 == 0) && (RVar2 = ParseConditions(this_00,nConditions,conditions_00), RVar2 == 0)) {
      RVar2 = SetUpFirstNode(this_00,&topNode);
      if (RVar2 != 0) {
        return RVar2;
      }
      if (bQueryPlans != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"PRINTING QUERY PLAN");
        std::endl<char,std::char_traits<char>>(poVar3);
        (*topNode->_vptr_QL_Node[5])(topNode,0);
      }
      this_01 = this_00;
      RVar2 = RunDelete(this_00,topNode);
      if (RVar2 != 0) {
        return RVar2;
      }
      RVar2 = CleanUpNodes(this_01,topNode);
      if (RVar2 != 0) {
        return RVar2;
      }
      free(this_00->relEntries);
      free(this_00->attrEntries);
      return 0;
    }
    free(this_00->relEntries);
    pAVar8 = this_00->attrEntries;
  }
  free(pAVar8);
  return RVar2;
}

Assistant:

RC QL_Manager::Delete(const char *relName,
                      int nConditions, const Condition conditions[])
{
  int i;

  cout << "Delete\n";

  cout << "   relName = " << relName << "\n";
  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  RC rc = 0;
  Reset();
  condptr = conditions;
  nConds = nConditions;
  
  // Make space for relation 
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry));
  memset((void*)relEntries, 0, sizeof(*relEntries));
  *relEntries = (RelCatEntry) {"\0", 0, 0, 0, 0, 0, true};
  if((rc = SetUpOneRelation(relName))){
    free(relEntries);
    return (rc);
  }
  // Make space for the list of attributes in this relation
  attrEntries = (AttrCatEntry *)malloc(relEntries->attrCount * sizeof(AttrCatEntry));
  memset((void*)attrEntries, 0, sizeof(*attrEntries));
  for(int i= 0 ; i < relEntries->attrCount; i++){
    *(attrEntries+i) = (AttrCatEntry) {"\0", "\0", 0, INT, 0, 0, 0, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = smm.GetAttrForRel(relEntries, attrEntries, attrToRel))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

  // Makes sure that the conditions are appropriate
  if(rc = ParseConditions(nConditions, conditions)){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

   // Create the query tree nodes
    QL_Node *topNode;
    if((rc = SetUpFirstNode(topNode)))
    return (rc);

  // Print the query plan
  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }
  
  if((rc = RunDelete(topNode))) // Run delete
    return (rc);
  
  if(rc = CleanUpNodes(topNode)) // Clean up the nodes
    return (rc);

  free(relEntries);
  free(attrEntries);

  return 0;
}